

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_result.hpp
# Opt level: O2

void __thiscall iutest::TestResult::RecordProperty(TestResult *this,TestProperty *prop)

{
  pointer pTVar1;
  bool bVar2;
  pointer pTVar3;
  
  pTVar3 = (this->m_test_propertys).
           super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->m_test_propertys).
           super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pTVar3 == pTVar1) {
      std::vector<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>::push_back
                (&this->m_test_propertys,prop);
      return;
    }
    bVar2 = detail::IsStringEqual((pTVar3->m_key)._M_dataplus._M_p,(prop->m_key)._M_dataplus._M_p);
    if (bVar2) break;
    pTVar3 = pTVar3 + 1;
  }
  std::__cxx11::string::_M_assign((string *)&pTVar3->m_value);
  return;
}

Assistant:

void RecordProperty(const TestProperty& prop)
    {
        for( TestPropertys::iterator it=m_test_propertys.begin()
            , end=m_test_propertys.end(); it != end; ++it )
        {
            if( detail::IsStringEqual(it->key(), prop.key()) )
            {
                it->m_value = prop.m_value;
                return;
            }
        }
        m_test_propertys.push_back(prop);
    }